

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

DynamicObject * __thiscall
JsrtDebuggerObjectProperty::GetChildren
          (JsrtDebuggerObjectProperty *this,ScriptContext *scriptContext,uint fromCount,
          uint totalCount)

{
  int iVar1;
  IDiagObjectModelDisplay *pIVar2;
  undefined4 extraout_var;
  DynamicObject *pDVar3;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *walkerRef;
  
  pIVar2 = Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference
                     (this->objectDisplay);
  if (pIVar2 == (IDiagObjectModelDisplay *)0x0) {
    pDVar3 = (DynamicObject *)0x0;
  }
  else {
    walkerRef = this->walkerRef;
    if (walkerRef == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
      iVar1 = (*pIVar2->_vptr_IDiagObjectModelDisplay[7])(pIVar2);
      walkerRef = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)CONCAT44(extraout_var,iVar1)
      ;
      this->walkerRef = walkerRef;
    }
    pDVar3 = JsrtDebuggerObjectBase::GetChildren
                       (&this->super_JsrtDebuggerObjectBase,walkerRef,scriptContext,fromCount,
                        totalCount);
    Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference
              (this->objectDisplay);
  }
  return pDVar3;
}

Assistant:

Js::DynamicObject* JsrtDebuggerObjectProperty::GetChildren(Js::ScriptContext* scriptContext, uint fromCount, uint totalCount)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = objectDisplay->GetStrongReference();
    if (objectDisplayRef == nullptr)
    {
        return nullptr;
    }

    if (this->walkerRef == nullptr)
    {
        this->walkerRef = objectDisplayRef->CreateWalker();
    }

    Js::DynamicObject* childrens = __super::GetChildren(this->walkerRef, scriptContext, fromCount, totalCount);

    objectDisplay->ReleaseStrongReference();

    return childrens;
}